

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

Token __thiscall flow::lang::Lexer::parseInterpolationFragment(Lexer *this,bool start)

{
  bool bVar1;
  int iVar2;
  Token TVar3;
  int local_20;
  int last;
  bool start_local;
  Lexer *this_local;
  
  local_20 = -1;
  std::__cxx11::string::clear();
  nextChar(this,true);
  while( true ) {
    bVar1 = eof(this);
    if (bVar1) {
      this->token_ = Eof;
      return Eof;
    }
    iVar2 = currentChar(this);
    if ((iVar2 == 0x22) && (local_20 != 0x5c)) break;
    iVar2 = currentChar(this);
    if (iVar2 == 0x5c) {
      nextChar(this,true);
      bVar1 = eof(this);
      if (bVar1) {
        this->token_ = Eof;
        return Eof;
      }
      iVar2 = currentChar(this);
      switch(iVar2) {
      case 0x5c:
        std::__cxx11::string::operator+=((string *)&this->stringValue_,'\\');
        break;
      default:
        std::__cxx11::string::operator+=((string *)&this->stringValue_,'\\');
        iVar2 = currentChar(this);
        std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
        break;
      case 0x6e:
        std::__cxx11::string::operator+=((string *)&this->stringValue_,'\n');
        break;
      case 0x72:
        std::__cxx11::string::operator+=((string *)&this->stringValue_,'\r');
        break;
      case 0x74:
        std::__cxx11::string::operator+=((string *)&this->stringValue_,'\t');
      }
    }
    else {
      iVar2 = currentChar(this);
      if (iVar2 == 0x23) {
        nextChar(this,true);
        iVar2 = currentChar(this);
        if (iVar2 == 0x7b) {
          nextChar(this,true);
          this->token_ = InterpolatedStringFragment;
          return InterpolatedStringFragment;
        }
        std::__cxx11::string::operator+=((string *)&this->stringValue_,'#');
        iVar2 = currentChar(this);
        std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
      }
      else {
        iVar2 = currentChar(this);
        std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
      }
    }
    local_20 = currentChar(this);
    nextChar(this,true);
  }
  nextChar(this,true);
  this->interpolationDepth_ = this->interpolationDepth_ + -1;
  TVar3 = InterpolatedStringEnd;
  if (start) {
    TVar3 = String;
  }
  this->token_ = TVar3;
  return TVar3;
}

Assistant:

Token Lexer::parseInterpolationFragment(bool start) {
  int last = -1;
  stringValue_.clear();

  // skip either '"' or '}' depending on your we entered
  nextChar();

  for (;;) {
    if (eof()) return token_ = Token::Eof;

    if (currentChar() == '"' && last != '\\') {
      nextChar();
      --interpolationDepth_;
      return token_ =
                 start ? Token::String : Token::InterpolatedStringEnd;
    }

    if (currentChar() == '\\') {
      nextChar();

      if (eof()) return token_ = Token::Eof;

      switch (currentChar()) {
        case 'r':
          stringValue_ += '\r';
          break;
        case 'n':
          stringValue_ += '\n';
          break;
        case 't':
          stringValue_ += '\t';
          break;
        case '\\':
          stringValue_ += '\\';
          break;
        default:
          stringValue_ += '\\';
          stringValue_ += static_cast<char>(currentChar());
          break;
      }
    } else if (currentChar() == '#') {
      nextChar();
      if (currentChar() == '{') {
        nextChar();
        return token_ = Token::InterpolatedStringFragment;
      } else {
        stringValue_ += '#';
      }
      stringValue_ += static_cast<char>(currentChar());
    } else {
      stringValue_ += static_cast<char>(currentChar());
    }

    last = currentChar();
    nextChar();
  }
}